

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_from_hex_pl(ptrlen hex)

{
  BignumInt *pBVar1;
  mp_int *pmVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  
  uVar4 = hex.len;
  if (uVar4 >> 0x3e == 0) {
    uVar6 = uVar4 * 4 + 0x3f >> 6;
    pmVar2 = mp_make_sized(uVar6 + (uVar6 == 0));
    if (uVar4 != 0) {
      pBVar1 = pmVar2->w;
      bVar5 = 0;
      uVar6 = 0;
      do {
        iVar3 = (int)*(char *)((long)hex.ptr + (uVar4 - 1));
        lVar7 = (long)iVar3;
        pBVar1[uVar6 >> 4] =
             pBVar1[uVar6 >> 4] |
             (ulong)(iVar3 + (uint)(-1 < (long)((0x46U - lVar7 | lVar7 - 0x41U) &
                                               (0x66U - lVar7 | lVar7 - 0x61U))) * 9 & 0xf) <<
             (bVar5 & 0x3c);
        uVar6 = uVar6 + 1;
        bVar5 = bVar5 + 4;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    return pmVar2;
  }
  __assert_fail("hex.len <= (~(size_t)0) / 4",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x106,"mp_int *mp_from_hex_pl(ptrlen)");
}

Assistant:

mp_int *mp_from_hex_pl(ptrlen hex)
{
    assert(hex.len <= (~(size_t)0) / 4);
    size_t bits = hex.len * 4;
    size_t words = (bits + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
    words = size_t_max(words, 1);
    mp_int *x = mp_make_sized(words);
    for (size_t nibble = 0; nibble < hex.len; nibble++) {
        BignumInt digit = ((const char *)hex.ptr)[hex.len-1 - nibble];

        BignumInt lmask = ~-((BignumInt)((digit-'a')|('f'-digit))
                             >> (BIGNUM_INT_BITS-1));
        BignumInt umask = ~-((BignumInt)((digit-'A')|('F'-digit))
                             >> (BIGNUM_INT_BITS-1));

        BignumInt digitval = digit - '0';
        digitval ^= (digitval ^ (digit - 'a' + 10)) & lmask;
        digitval ^= (digitval ^ (digit - 'A' + 10)) & umask;
        digitval &= 0xF; /* at least be _slightly_ nice about weird input */

        size_t word_idx = nibble / (BIGNUM_INT_BYTES*2);
        size_t nibble_within_word = nibble % (BIGNUM_INT_BYTES*2);
        x->w[word_idx] |= digitval << (nibble_within_word * 4);
    }
    return x;
}